

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall doctest::String::operator+=(String *this,String *other)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  char *__src;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  
  bVar2 = (this->field_0).buf[0x17];
  if ((char)bVar2 < '\0') {
    uVar7 = (this->field_0).data.size;
  }
  else {
    uVar7 = 0x17 - (bVar2 & 0x1f);
  }
  bVar3 = (other->field_0).buf[0x17];
  if ((char)bVar3 < '\0') {
    uVar8 = (other->field_0).data.size;
  }
  else {
    uVar8 = 0x17 - (bVar3 & 0x1f);
  }
  uVar1 = uVar8 + uVar7;
  if ((char)bVar2 < '\0') {
    uVar4 = (this->field_0).data.capacity;
    if (uVar1 < uVar4) {
      (this->field_0).data.size = uVar1;
      pcVar6 = (this->field_0).data.ptr + uVar7;
      if ((other->field_0).buf[0x17] < '\0') {
        other = (String *)(other->field_0).data.ptr;
      }
      goto LAB_00113c39;
    }
    uVar4 = uVar4 * 2;
    uVar5 = uVar1 + 1;
    if (uVar1 < uVar4) {
      uVar5 = uVar4;
    }
    (this->field_0).data.capacity = uVar5;
    pcVar6 = (char *)operator_new__((ulong)uVar5);
    __src = (this->field_0).data.ptr;
    memcpy(pcVar6,__src,(ulong)uVar7);
    if (__src != (char *)0x0) {
      operator_delete__(__src);
    }
    (this->field_0).data.size = uVar1;
    (this->field_0).data.ptr = pcVar6;
    pcVar6 = pcVar6 + uVar7;
  }
  else {
    if (uVar1 < 0x18) {
      if ((char)bVar3 < '\0') {
        other = (String *)(other->field_0).data.ptr;
      }
      memcpy((void *)((long)&this->field_0 + (ulong)uVar7),other,(ulong)(uVar8 + 1));
      (this->field_0).buf[0x17] = '\x17' - (char)uVar1;
      return this;
    }
    pcVar6 = (char *)operator_new__((ulong)(uVar1 + 1));
    memcpy(pcVar6,this,(ulong)uVar7);
    (this->field_0).buf[0x17] = -0x80;
    (this->field_0).data.size = uVar1;
    (this->field_0).data.capacity = uVar1 + 1;
    (this->field_0).data.ptr = pcVar6;
    pcVar6 = pcVar6 + uVar7;
  }
  if ((other->field_0).buf[0x17] < '\0') {
    other = (String *)(other->field_0).data.ptr;
  }
LAB_00113c39:
  memcpy(pcVar6,other,(ulong)(uVar8 + 1));
  return this;
}

Assistant:

String& String::operator+=(const String& other) {
    const unsigned my_old_size = size();
    const unsigned other_size  = other.size();
    const unsigned total_size  = my_old_size + other_size;
    if(isOnStack()) {
        if(total_size < len) {
            // append to the current stack space
            memcpy(buf + my_old_size, other.c_str(), other_size + 1);
            // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
            setLast(last - total_size);
        } else {
            // alloc new chunk
            char* temp = new char[total_size + 1];
            // copy current data to new location before writing in the union
            memcpy(temp, buf, my_old_size); // skip the +1 ('\0') for speed
            // update data in union
            setOnHeap();
            data.size     = total_size;
            data.capacity = data.size + 1;
            data.ptr      = temp;
            // transfer the rest of the data
            memcpy(data.ptr + my_old_size, other.c_str(), other_size + 1);
        }
    } else {
        if(data.capacity > total_size) {
            // append to the current heap block
            data.size = total_size;
            memcpy(data.ptr + my_old_size, other.c_str(), other_size + 1);
        } else {
            // resize
            data.capacity *= 2;
            if(data.capacity <= total_size)
                data.capacity = total_size + 1;
            // alloc new chunk
            char* temp = new char[data.capacity];
            // copy current data to new location before releasing it
            memcpy(temp, data.ptr, my_old_size); // skip the +1 ('\0') for speed
            // release old chunk
            delete[] data.ptr;
            // update the rest of the union members
            data.size = total_size;
            data.ptr  = temp;
            // transfer the rest of the data
            memcpy(data.ptr + my_old_size, other.c_str(), other_size + 1);
        }
    }

    return *this;
}